

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O1

ostream * opts::operator<<(ostream *out,Options *ops)

{
  _List_node_base *p_Var1;
  int max_long;
  int iVar2;
  const_iterator __end2;
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *plVar3;
  
  p_Var1 = (ops->options).
           super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  plVar3 = &ops->options;
  if (p_Var1 == (_List_node_base *)plVar3) {
    max_long = 0;
  }
  else {
    max_long = 0;
    do {
      iVar2 = *(int *)((long)(p_Var1[1]._M_next + 1) + 8) +
              *(int *)((long)(p_Var1[1]._M_next + 5) + 8) + 1;
      if (iVar2 < max_long) {
        iVar2 = max_long;
      }
      max_long = iVar2;
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)plVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"Options:\n",9);
  for (p_Var1 = (plVar3->
                super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)plVar3
      ; p_Var1 = p_Var1->_M_next) {
    BasicOption::output((BasicOption *)p_Var1[1]._M_next,out,max_long);
  }
  return out;
}

Assistant:

std::ostream&
    operator<<(std::ostream& out, const Options& ops)
    {
        int max_long = 0;
        for (auto& cur : ops.options)
        {
            int cur_long = cur->long_size();
            if (cur_long > max_long)
                max_long = cur_long;
        }

        out << "Options:\n";
        for (auto& cur : ops.options)
            cur->output(out, max_long);

        return out;
    }